

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool string_loop(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *closure;
  _Bool _Var1;
  gravity_fiber_t *fiber;
  nanotime_t nVar2;
  nanotime_t nVar3;
  gravity_class_t *s;
  ulong uVar4;
  bool bVar5;
  gravity_value_t gVar6;
  gravity_value_t gVar7;
  char _buffer [4096];
  
  if (nargs < 2) {
    builtin_strncpy(_buffer + 0x10," of arguments.",0xf);
    _buffer[0] = 'I';
    _buffer[1] = 'n';
    _buffer[2] = 'c';
    _buffer[3] = 'o';
    _buffer[4] = 'r';
    _buffer[5] = 'r';
    _buffer[6] = 'e';
    _buffer[7] = 'c';
    _buffer[8] = 't';
    _buffer[9] = ' ';
    _buffer[10] = 'n';
    _buffer[0xb] = 'u';
    _buffer[0xc] = 'm';
    _buffer[0xd] = 'b';
    _buffer[0xe] = 'e';
    _buffer[0xf] = 'r';
  }
  else {
    if (args[1].isa == gravity_class_closure) {
      closure = args[1].field_1.p;
      gVar6 = *args;
      s = ((args->field_1).p)->objclass;
      uVar4 = (ulong)*(uint *)((long)&((args->field_1).p)->identifier + 4);
      nVar2 = nanotime();
      do {
        bVar5 = uVar4 == 0;
        uVar4 = uVar4 - 1;
        if (bVar5) {
          nVar3 = nanotime();
          gVar6.field_1.p = (gravity_object_t *)(nVar3 - nVar2);
          gVar6.isa = gravity_class_int;
          gravity_vm_setslot(vm,gVar6,rindex);
          return true;
        }
        gVar7 = gravity_string_to_value(vm,(char *)s,1);
        _buffer._0_4_ = gVar7.isa._0_4_;
        _buffer._4_4_ = gVar7.isa._4_4_;
        _buffer._8_4_ = gVar7.field_1._0_4_;
        _buffer._12_4_ = gVar7.field_1._4_4_;
        _Var1 = gravity_vm_runclosure
                          (vm,(gravity_closure_t *)closure,gVar6,(gravity_value_t *)_buffer,1);
        s = (gravity_class_t *)((long)&s->isa + 1);
      } while (_Var1);
      return false;
    }
    builtin_strncpy(_buffer + 0x10," a Closure.",0xc);
    _buffer[0] = 'A';
    _buffer[1] = 'r';
    _buffer[2] = 'g';
    _buffer[3] = 'u';
    _buffer[4] = 'm';
    _buffer[5] = 'e';
    _buffer[6] = 'n';
    _buffer[7] = 't';
    _buffer[8] = ' ';
    _buffer[9] = 'm';
    _buffer[10] = 'u';
    _buffer[0xb] = 's';
    _buffer[0xc] = 't';
    _buffer[0xd] = ' ';
    _buffer[0xe] = 'b';
    _buffer[0xf] = 'e';
  }
  fiber = gravity_vm_fiber(vm);
  gravity_fiber_seterror(fiber,_buffer);
  gVar7.field_1.n = 0;
  gVar7.isa = gravity_class_null;
  gravity_vm_setslot(vm,gVar7,rindex);
  return false;
}

Assistant:

static bool string_loop (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_ERROR("Incorrect number of arguments.");
    if (!VALUE_ISA_CLOSURE(GET_VALUE(1))) RETURN_ERROR("Argument must be a Closure.");

    gravity_closure_t *closure = VALUE_AS_CLOSURE(GET_VALUE(1));    // closure to execute
    gravity_value_t value = GET_VALUE(0);                            // self parameter
    gravity_string_t *string = VALUE_AS_STRING(value);
    char *str = string->s;
    register gravity_int_t n = string->len;  // Times to execute the loop
    register gravity_int_t i = 0;

    nanotime_t t1 = nanotime();
    while (i < n) {
        gravity_value_t v_str = VALUE_FROM_STRING(vm, str + i, 1);
        if (!gravity_vm_runclosure(vm, closure, value, &v_str, 1)) return false;
        ++i;
    }
    nanotime_t t2 = nanotime();
    RETURN_VALUE(VALUE_FROM_INT(t2-t1), rindex);
}